

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilterCoordinator.cpp
# Opt level: O0

void __thiscall helics::FilterCoordinator::closeFilter(FilterCoordinator *this,GlobalHandle filt)

{
  GlobalBrokerId *this_00;
  FilterInfo *M;
  bool bVar1;
  GlobalBrokerId id;
  reference ppFVar2;
  undefined8 in_RSI;
  long in_RDI;
  FilterInfo *cFilt;
  iterator __end1_1;
  iterator __begin1_1;
  vector<helics::FilterInfo_*,_std::allocator<helics::FilterInfo_*>_> *__range1_1;
  FilterInfo *sFilt;
  iterator __end1;
  iterator __begin1;
  vector<helics::FilterInfo_*,_std::allocator<helics::FilterInfo_*>_> *__range1;
  FilterInfo *in_stack_ffffffffffffff78;
  FilterInfo *in_stack_ffffffffffffff80;
  __normal_iterator<helics::FilterInfo_**,_std::vector<helics::FilterInfo_*,_std::allocator<helics::FilterInfo_*>_>_>
  local_50;
  long local_48;
  BaseType local_40;
  BaseType local_3c;
  FilterInfo *local_38;
  FilterInfo **local_30;
  __normal_iterator<helics::FilterInfo_**,_std::vector<helics::FilterInfo_*,_std::allocator<helics::FilterInfo_*>_>_>
  local_28;
  long local_20;
  BaseType local_18;
  BaseType local_14;
  undefined8 local_8;
  
  local_8 = in_RSI;
  if (*(long *)(in_RDI + 0x18) != 0) {
    this_00 = *(GlobalBrokerId **)(in_RDI + 0x18);
    local_14 = (BaseType)
               GlobalFederateId::operator_cast_to_GlobalBrokerId
                         ((GlobalFederateId *)in_stack_ffffffffffffff78);
    bVar1 = GlobalBrokerId::operator==(this_00,(GlobalBrokerId)local_14);
    if (bVar1) {
      local_18 = local_8._4_4_;
      bVar1 = InterfaceHandle::operator==
                        ((InterfaceHandle *)(*(long *)(in_RDI + 0x18) + 4),local_8._4_4_);
      if (bVar1) {
        setActionFlag<helics::FilterInfo,helics::ConnectionFlags>
                  (*(FilterInfo **)(in_RDI + 0x18),disconnected_flag);
      }
    }
  }
  local_20 = in_RDI + 0x20;
  local_28._M_current =
       (FilterInfo **)
       std::vector<helics::FilterInfo_*,_std::allocator<helics::FilterInfo_*>_>::begin
                 ((vector<helics::FilterInfo_*,_std::allocator<helics::FilterInfo_*>_> *)
                  in_stack_ffffffffffffff78);
  local_30 = (FilterInfo **)
             std::vector<helics::FilterInfo_*,_std::allocator<helics::FilterInfo_*>_>::end
                       ((vector<helics::FilterInfo_*,_std::allocator<helics::FilterInfo_*>_> *)
                        in_stack_ffffffffffffff78);
  while (bVar1 = __gnu_cxx::
                 operator==<helics::FilterInfo_**,_std::vector<helics::FilterInfo_*,_std::allocator<helics::FilterInfo_*>_>_>
                           ((__normal_iterator<helics::FilterInfo_**,_std::vector<helics::FilterInfo_*,_std::allocator<helics::FilterInfo_*>_>_>
                             *)in_stack_ffffffffffffff80,
                            (__normal_iterator<helics::FilterInfo_**,_std::vector<helics::FilterInfo_*,_std::allocator<helics::FilterInfo_*>_>_>
                             *)in_stack_ffffffffffffff78), ((bVar1 ^ 0xffU) & 1) != 0) {
    ppFVar2 = __gnu_cxx::
              __normal_iterator<helics::FilterInfo_**,_std::vector<helics::FilterInfo_*,_std::allocator<helics::FilterInfo_*>_>_>
              ::operator*(&local_28);
    in_stack_ffffffffffffff80 = *ppFVar2;
    local_38 = in_stack_ffffffffffffff80;
    local_3c = (BaseType)
               GlobalFederateId::operator_cast_to_GlobalBrokerId
                         ((GlobalFederateId *)in_stack_ffffffffffffff78);
    bVar1 = GlobalBrokerId::operator==(&in_stack_ffffffffffffff80->core_id,(GlobalBrokerId)local_3c)
    ;
    if (bVar1) {
      local_40 = local_8._4_4_;
      bVar1 = InterfaceHandle::operator==(&local_38->handle,local_8._4_4_);
      if (bVar1) {
        setActionFlag<helics::FilterInfo,helics::ConnectionFlags>(local_38,disconnected_flag);
      }
    }
    __gnu_cxx::
    __normal_iterator<helics::FilterInfo_**,_std::vector<helics::FilterInfo_*,_std::allocator<helics::FilterInfo_*>_>_>
    ::operator++(&local_28);
  }
  local_48 = in_RDI + 0x38;
  local_50._M_current =
       (FilterInfo **)
       std::vector<helics::FilterInfo_*,_std::allocator<helics::FilterInfo_*>_>::begin
                 ((vector<helics::FilterInfo_*,_std::allocator<helics::FilterInfo_*>_> *)
                  in_stack_ffffffffffffff78);
  std::vector<helics::FilterInfo_*,_std::allocator<helics::FilterInfo_*>_>::end
            ((vector<helics::FilterInfo_*,_std::allocator<helics::FilterInfo_*>_> *)
             in_stack_ffffffffffffff78);
  while (bVar1 = __gnu_cxx::
                 operator==<helics::FilterInfo_**,_std::vector<helics::FilterInfo_*,_std::allocator<helics::FilterInfo_*>_>_>
                           ((__normal_iterator<helics::FilterInfo_**,_std::vector<helics::FilterInfo_*,_std::allocator<helics::FilterInfo_*>_>_>
                             *)in_stack_ffffffffffffff80,
                            (__normal_iterator<helics::FilterInfo_**,_std::vector<helics::FilterInfo_*,_std::allocator<helics::FilterInfo_*>_>_>
                             *)in_stack_ffffffffffffff78), ((bVar1 ^ 0xffU) & 1) != 0) {
    ppFVar2 = __gnu_cxx::
              __normal_iterator<helics::FilterInfo_**,_std::vector<helics::FilterInfo_*,_std::allocator<helics::FilterInfo_*>_>_>
              ::operator*(&local_50);
    M = *ppFVar2;
    in_stack_ffffffffffffff78 = M;
    id = GlobalFederateId::operator_cast_to_GlobalBrokerId((GlobalFederateId *)M);
    bVar1 = GlobalBrokerId::operator==(&in_stack_ffffffffffffff78->core_id,id);
    if (bVar1) {
      bVar1 = InterfaceHandle::operator==(&M->handle,local_8._4_4_);
      if (bVar1) {
        setActionFlag<helics::FilterInfo,helics::ConnectionFlags>(M,disconnected_flag);
      }
    }
    __gnu_cxx::
    __normal_iterator<helics::FilterInfo_**,_std::vector<helics::FilterInfo_*,_std::allocator<helics::FilterInfo_*>_>_>
    ::operator++(&local_50);
  }
  return;
}

Assistant:

void FilterCoordinator::closeFilter(GlobalHandle filt)
{
    if (destFilter != nullptr) {
        if ((destFilter->core_id == filt.fed_id) && (destFilter->handle == filt.handle)) {
            setActionFlag(*destFilter, disconnected_flag);
        }
    }
    for (auto sFilt : allSourceFilters) {
        if ((sFilt->core_id == filt.fed_id) && (sFilt->handle == filt.handle)) {
            setActionFlag(*sFilt, disconnected_flag);
        }
    }
    for (auto cFilt : cloningDestFilters) {
        if ((cFilt->core_id == filt.fed_id) && (cFilt->handle == filt.handle)) {
            setActionFlag(*cFilt, disconnected_flag);
        }
    }
}